

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# java_service.cc
# Opt level: O0

void __thiscall
google::protobuf::compiler::java::ImmutableServiceGenerator::GenerateNewReflectiveServiceMethod
          (ImmutableServiceGenerator *this,Printer *printer)

{
  int iVar1;
  Printer *this_00;
  int iVar2;
  string *args_1;
  MethodDescriptor *method_00;
  string local_48;
  MethodDescriptor *local_28;
  MethodDescriptor *method;
  Printer *pPStack_18;
  int i;
  Printer *printer_local;
  ImmutableServiceGenerator *this_local;
  
  pPStack_18 = printer;
  printer_local = (Printer *)this;
  args_1 = ServiceDescriptor::name_abi_cxx11_((this->super_ServiceGenerator).descriptor_);
  io::Printer::Print<char[10],std::__cxx11::string>
            (printer,
             "public static com.google.protobuf.Service newReflectiveService(\n    final Interface impl) {\n  return new $classname$() {\n"
             ,(char (*) [10])0x77c586,args_1);
  io::Printer::Indent(pPStack_18);
  io::Printer::Indent(pPStack_18);
  method._4_4_ = 0;
  while( true ) {
    iVar1 = method._4_4_;
    iVar2 = ServiceDescriptor::method_count((this->super_ServiceGenerator).descriptor_);
    if (iVar2 <= iVar1) break;
    local_28 = ServiceDescriptor::method((this->super_ServiceGenerator).descriptor_,method._4_4_);
    io::Printer::Print<>(pPStack_18,"@java.lang.Override\n");
    GenerateMethodSignature(this,pPStack_18,local_28,IS_CONCRETE);
    this_00 = pPStack_18;
    UnderscoresToCamelCase_abi_cxx11_(&local_48,(java *)local_28,method_00);
    io::Printer::Print<char[7],std::__cxx11::string>
              (this_00," {\n  impl.$method$(controller, request, done);\n}\n\n",
               (char (*) [7])"method",&local_48);
    std::__cxx11::string::~string((string *)&local_48);
    method._4_4_ = method._4_4_ + 1;
  }
  io::Printer::Outdent(pPStack_18);
  io::Printer::Print<>(pPStack_18,"};\n");
  io::Printer::Outdent(pPStack_18);
  io::Printer::Print<>(pPStack_18,"}\n\n");
  return;
}

Assistant:

void ImmutableServiceGenerator::GenerateNewReflectiveServiceMethod(
    io::Printer* printer) {
  printer->Print(
      "public static com.google.protobuf.Service newReflectiveService(\n"
      "    final Interface impl) {\n"
      "  return new $classname$() {\n",
      "classname", descriptor_->name());
  printer->Indent();
  printer->Indent();

  for (int i = 0; i < descriptor_->method_count(); i++) {
    const MethodDescriptor* method = descriptor_->method(i);
    printer->Print("@java.lang.Override\n");
    GenerateMethodSignature(printer, method, IS_CONCRETE);
    printer->Print(
        " {\n"
        "  impl.$method$(controller, request, done);\n"
        "}\n\n",
        "method", UnderscoresToCamelCase(method));
  }

  printer->Outdent();
  printer->Print("};\n");
  printer->Outdent();
  printer->Print("}\n\n");
}